

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall gulps::message::message(message *this,message *param_1)

{
  this->lvl = param_1->lvl;
  this->time = param_1->time;
  std::__cxx11::string::string((string *)&this->cat_major,(string *)&param_1->cat_major);
  std::__cxx11::string::string((string *)&this->cat_minor,(string *)&param_1->cat_minor);
  std::__cxx11::string::string((string *)&this->src_path,(string *)&param_1->src_path);
  this->src_line = param_1->src_line;
  std::__cxx11::string::string((string *)&this->thread_id,(string *)&param_1->thread_id);
  std::__cxx11::string::string((string *)&this->text,(string *)&param_1->text);
  this->clr = param_1->clr;
  return;
}

Assistant:

message(message&& ) = default;